

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildValue.h
# Opt level: O0

void __thiscall
llbuild::buildsystem::BuildValue::BuildValue
          (BuildValue *this,Kind kind,
          ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          values)

{
  bool bVar1;
  uint8_t *local_40;
  Kind kind_local;
  BuildValue *this_local;
  ArrayRef<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  values_local;
  
  this->kind = kind;
  this->numOutputInfos = 0;
  llbuild::basic::CommandSignature::CommandSignature(&this->signature);
  (this->valueData).asOutputInfo.device = 0;
  (this->valueData).asOutputInfo.inode = 0;
  (this->valueData).asOutputInfo.mode = 0;
  (this->valueData).asOutputInfo.size = 0;
  (this->valueData).asOutputInfo.modTime.seconds = 0;
  (this->valueData).asOutputInfo.modTime.nanoseconds = 0;
  (this->valueData).asOutputInfo.checksum.bytes[0] = '\0';
  local_40 = (this->valueData).asOutputInfo.checksum.bytes + 1;
  do {
    *local_40 = '\0';
    local_40 = local_40 + 1;
  } while ((StringList *)local_40 != &this->stringValues);
  llbuild::basic::StringList::StringList<std::__cxx11::string>(&this->stringValues,values);
  bVar1 = kindHasStringList(this);
  if (!bVar1) {
    __assert_fail("kindHasStringList()",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llbuild/BuildSystem/BuildValue.h"
                  ,0xb3,"llbuild::buildsystem::BuildValue::BuildValue(Kind, ArrayRef<std::string>)")
    ;
  }
  return;
}

Assistant:

BuildValue(Kind kind, ArrayRef<std::string> values)
      : kind(kind), stringValues(values) {
    assert(kindHasStringList());
  }